

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall nigel::Token_Comment::Token_Comment(Token_Comment *this,String *comment)

{
  String *comment_local;
  Token_Comment *this_local;
  
  Token::Token(&this->super_Token,comment);
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Token_Comment_002b6cc8;
  std::__cxx11::string::string((string *)&this->comment);
  std::__cxx11::string::operator=((string *)&this->comment,(string *)comment);
  return;
}

Assistant:

Token_Comment( String comment ) : Token( Type::comment )
		{
			this->comment = comment;
		}